

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::func_decl(analysis *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  int iVar3;
  ostream *poVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  analysis *in_RSI;
  NodePtr NVar6;
  NodePtr tmp_ptr;
  string tmp_str;
  int lineno;
  NodePtr local_98;
  string local_88;
  undefined1 local_68 [48];
  FILE local_38 [16];
  
  token::getVal_abi_cxx11_
            (&local_88,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_68._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
            (&local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TreeNode **)&local_98,(allocator<dh::TreeNode> *)(local_68 + 0x1c),&local_88,
             (int *)local_68);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
  }
  token::getVal_abi_cxx11_
            (&local_88,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar3 = std::__cxx11::string::compare((char *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
  }
  if (iVar3 == 0) {
    local_88._M_dataplus._M_p._0_4_ = 2;
    TreeNode::setType(local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (int *)&local_88);
  }
  else {
    token::getVal_abi_cxx11_
              (&local_88,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
    }
    if (iVar3 == 0) {
      local_88._M_dataplus._M_p._0_4_ = 3;
      TreeNode::setType(local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(int *)&local_88);
    }
    else {
      token::getVal_abi_cxx11_
                (&local_88,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar3 = std::__cxx11::string::compare((char *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
      }
      if (iVar3 == 0) {
        local_88._M_dataplus._M_p._0_4_ = 4;
        TreeNode::setType(local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(int *)&local_88);
      }
      else {
        token::getVal_abi_cxx11_
                  (&local_88,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != paVar1)
        {
          operator_delete((undefined1 *)
                          CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_))
          ;
        }
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ERROR] Unexpected type \"",0x19);
          token::getVal_abi_cxx11_
                    (&local_88,
                     (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                               local_88._M_dataplus._M_p._0_4_),
                              local_88._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" in line ",10);
          iVar3 = token::getLineno((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_88);
          exit(1);
        }
        local_88._M_dataplus._M_p._0_4_ = 0;
        TreeNode::setType(local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(int *)&local_88);
      }
    }
  }
  token::getVal_abi_cxx11_
            ((string *)(local_68 + 0x20),
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  match(in_RSI,(string *)(local_68 + 0x20));
  if ((FILE *)local_68._32_8_ != local_38) {
    operator_delete((void *)local_68._32_8_);
  }
  local_68._28_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  identifier_abi_cxx11_(&local_88,in_RSI);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string&,int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->current_tab,(TreeNode **)this,
             (allocator<dh::TreeNode> *)local_68,&local_88,(int *)(local_68 + 0x1c));
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_68);
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_68);
  TreeNode::appendChild(*(TreeNode **)this,&local_98);
  para_list((analysis *)local_68);
  uVar2 = local_68._8_8_;
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._0_8_;
  _Var5._M_pi = local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_68._0_8_ = (element_type *)0x0;
  local_68._8_8_ = (element_type *)0x0;
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  TreeNode::appendChild(*(TreeNode **)this,&local_98);
  in_RSI->layer_record = in_RSI->layer_record + 1;
  compound_stmt((analysis *)local_68);
  uVar2 = local_68._8_8_;
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._0_8_;
  _Var5._M_pi = local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_68._0_4_ = 0;
  local_68[4] = false;
  local_68._5_3_ = 0;
  local_68._8_8_ = (element_type *)0x0;
  local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  in_RSI->layer_record = in_RSI->layer_record + -1;
  TreeNode::appendChild(*(TreeNode **)this,&local_98);
  _Var5._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
    _Var5._M_pi = extraout_RDX_00;
  }
  if (local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var5._M_pi = extraout_RDX_01;
  }
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::func_decl()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in func_decl, get type " << tmp->getVal() << ::std::endl;
#endif
	
	NodePtr tmp_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
	if ( tmp->getVal() == "int")
	{
		tmp_ptr->setType(TypeKind::IntK);
	} else if ( tmp->getVal() == "float")
	{
		tmp_ptr->setType(TypeKind::FloatK); 
	} else if ( tmp->getVal() == "void")
	{
		tmp_ptr->setType(TypeKind::VoidK);
	} else if (tmp->getVal() == "boolean")
	{
		tmp_ptr->setType(TypeKind::BoolK);
	} else 
	{
		::std::cerr << "[ERROR] Unexpected type \""
			<< tmp->getVal() 
			<< "\" in line "
			<< tmp->getLineno()
			<< ::std::endl;
		::std::exit(1);
	}
	match(tmp->getVal());

	int lineno = tmp->getLineno();
	::std::string tmp_str = identifier();
	NodePtr ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
	ret->setNodeKind(NodeKind::DeclK);
	ret->setKind(DeclKind::FuncK);
	ret->appendChild(tmp_ptr);

	tmp_ptr = para_list();
	ret->appendChild(tmp_ptr);

	this->layer_record++;
	tmp_ptr = compound_stmt();
	this->layer_record--;

	ret->appendChild(tmp_ptr);
	return ret;
}